

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form3_ExtractChannel(ExtractChannelForm3 ExtractChannel)

{
  uint8_t value;
  bool bVar1;
  uint uVar2;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  uint32_t local_90;
  uint32_t local_8c;
  uint32_t local_88;
  uint32_t local_84;
  ImageTemplate<unsigned_char> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  Image local_40;
  
  Unit_Test::intensityArray(&local_58,3);
  value = *local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,0,0,'\x01','\x01');
  Test_Helper::uniformRGBImage(&local_40,value,&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  Unit_Test::fillImage(&local_40,0,0,local_40._width,local_40._height,&local_58);
  uVar2 = rand();
  Unit_Test::generateRoi(&local_40,&local_84,&local_88,&local_8c,&local_90);
  (*ExtractChannel)(&local_80,&local_40,local_84,local_88,local_8c,local_90,(uint8_t)(uVar2 % 3));
  bVar1 = Unit_Test::verifyImage
                    (&local_80,
                     local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar2 % 3]);
  if (bVar1) {
    bVar1 = Unit_Test::equalSize(&local_80,local_8c,local_90);
    if (bVar1) {
      bVar1 = local_80._colorCount == '\x01';
      goto LAB_0014ef50;
    }
  }
  bVar1 = false;
LAB_0014ef50:
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_40._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_40);
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool form3_ExtractChannel(ExtractChannelForm3 ExtractChannel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        PenguinV_Image::Image input = uniformRGBImage( intensity[0] );
        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        const uint8_t channelId = randomValue<uint8_t>( 3 );

        uint32_t roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const PenguinV_Image::Image output = ExtractChannel( input, roiX, roiY, roiWidth, roiHeight, channelId );

        return verifyImage( output, intensity[channelId] ) && equalSize( output, roiWidth, roiHeight ) && (output.colorCount() == PenguinV_Image::GRAY_SCALE);
    }